

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O0

char * flatcc_json_parser_array_end(flatcc_json_parser_t *ctx,char *buf,char *end,int *more)

{
  int *more_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_space(ctx,buf,end);
  if (ctx_local == (flatcc_json_parser_t *)end) {
    *more = 0;
  }
  else if (*(char *)&ctx_local->ctx == ',') {
    ctx_local = (flatcc_json_parser_t *)
                flatcc_json_parser_space(ctx,(char *)((long)&ctx_local->ctx + 1),end);
    if (ctx_local == (flatcc_json_parser_t *)end) {
      *more = 0;
      ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,(char *)ctx_local,end,9);
    }
    else if (*(char *)&ctx_local->ctx == ']') {
      *more = 0;
      ctx_local = (flatcc_json_parser_t *)
                  flatcc_json_parser_space(ctx,(char *)((long)&ctx_local->ctx + 1),end);
    }
    else {
      *more = 1;
    }
  }
  else {
    *more = 0;
    if (*(char *)&ctx_local->ctx == ']') {
      ctx_local = (flatcc_json_parser_t *)
                  flatcc_json_parser_space(ctx,(char *)((long)&ctx_local->ctx + 1),end);
    }
    else {
      ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,(char *)ctx_local,end,9);
    }
  }
  return (char *)ctx_local;
}

Assistant:

static inline const char *flatcc_json_parser_array_end(flatcc_json_parser_t *ctx, const char *buf,
        const char *end, int *more)
{
    buf = flatcc_json_parser_space(ctx, buf, end);
    if (buf == end) {
        *more = 0;
        return buf;
    }
    if (*buf != ',') {
        *more = 0;
        if (*buf != ']') {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unbalanced_array);
        } else {
            return flatcc_json_parser_space(ctx, buf + 1, end);
        }
    }
    buf = flatcc_json_parser_space(ctx, buf + 1, end);
    if (buf == end) {
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unbalanced_array);
    }
#if FLATCC_JSON_PARSE_ALLOW_TRAILING_COMMA
    if (*buf == ']') {
        *more = 0;
        return flatcc_json_parser_space(ctx, buf + 1, end);
    }
#endif
    *more = 1;
    return buf;
}